

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Get_MM_Var(T1_Face face,FT_MM_Var **master)

{
  FT_Memory memory;
  PS_Blend pPVar1;
  char *__s1;
  int iVar2;
  FT_MM_Var *pFVar3;
  undefined8 uVar4;
  FT_Fixed FVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  FT_Fixed *axiscoords_00;
  FT_Error error;
  FT_Multi_Master mmaster;
  FT_Fixed axiscoords [4];
  int local_d4;
  ulong local_d0;
  FT_MM_Var **local_c8;
  FT_Multi_Master local_c0;
  FT_Fixed local_58 [5];
  
  memory = (face->root).memory;
  pPVar1 = face->blend;
  local_d4 = T1_Get_Multi_Master(face,&local_c0);
  if (local_d4 == 0) {
    uVar8 = (ulong)local_c0.num_axis;
    uVar6 = uVar8 * 2 + 7 & 0xfffffffffffffff8;
    pFVar3 = (FT_MM_Var *)ft_mem_alloc(memory,uVar8 * 0x30 + uVar6 + 0x20,&local_d4);
    if (local_d4 == 0) {
      pFVar3->num_axis = local_c0.num_axis;
      pFVar3->num_designs = local_c0.num_designs;
      pFVar3->num_namedstyles = 0;
      local_c8 = master;
      if (local_c0.num_axis != 0) {
        memset(pFVar3 + 1,0,uVar8 * 2);
      }
      pFVar3->axis = (FT_Var_Axis *)((long)&pFVar3[1].num_axis + uVar6);
      pFVar3->namedstyle = (FT_Var_Named_Style *)0x0;
      local_d0 = uVar8;
      if (local_c0.num_axis != 0) {
        lVar7 = 0;
        do {
          __s1 = *(char **)((long)&local_c0.axis[0].name + lVar7);
          *(char **)((long)&pFVar3[1].num_axis + lVar7 * 2 + uVar6) = __s1;
          *(long *)((long)&pFVar3[1].num_namedstyles + lVar7 * 2 + uVar6) =
               *(long *)((long)&local_c0.axis[0].minimum + lVar7) << 0x10;
          *(long *)((long)&pFVar3[1].namedstyle + lVar7 * 2 + uVar6) =
               *(long *)((long)&local_c0.axis[0].maximum + lVar7) << 0x10;
          *(undefined4 *)((long)&pFVar3[2].num_namedstyles + lVar7 * 2 + uVar6) = 0xffffffff;
          *(undefined8 *)((long)&pFVar3[2].num_axis + lVar7 * 2 + uVar6) = 0xffffffff;
          if (__s1 != (char *)0x0) {
            iVar2 = strcmp(__s1,"Weight");
            if (iVar2 == 0) {
              uVar4 = 0x77676874;
            }
            else {
              iVar2 = strcmp(__s1,"Width");
              if (iVar2 == 0) {
                uVar4 = 0x77647468;
              }
              else {
                iVar2 = strcmp(__s1,"OpticalSize");
                if (iVar2 == 0) {
                  uVar4 = 0x6f70737a;
                }
                else {
                  iVar2 = strcmp(__s1,"Slant");
                  if (iVar2 == 0) {
                    uVar4 = 0x736c6e74;
                  }
                  else {
                    iVar2 = strcmp(__s1,"Italic");
                    if (iVar2 != 0) goto LAB_002643cc;
                    uVar4 = 0x6974616c;
                  }
                }
              }
            }
            *(undefined8 *)((long)&pFVar3[2].num_axis + lVar7 * 2 + uVar6) = uVar4;
          }
LAB_002643cc:
          lVar7 = lVar7 + 0x18;
        } while (uVar8 * 0x18 != lVar7);
      }
      axiscoords_00 = local_58;
      mm_weights_unmap(pPVar1->default_weight_vector,axiscoords_00,pPVar1->num_axis);
      if ((int)local_d0 != 0) {
        lVar7 = local_d0 * 0x18;
        lVar9 = 0;
        do {
          FVar5 = mm_axis_unmap((PS_DesignMap)(&pPVar1->design_map[0].num_points + lVar9),
                                *axiscoords_00);
          *(FT_Fixed *)((long)&pFVar3->axis->def + lVar9 * 2) = FVar5;
          lVar9 = lVar9 + 0x18;
          axiscoords_00 = axiscoords_00 + 1;
        } while (lVar7 != lVar9);
      }
      *local_c8 = pFVar3;
    }
  }
  return local_d4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Var( T1_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Memory        memory = face->root.memory;
    FT_MM_Var       *mmvar = NULL;
    FT_Multi_Master  mmaster;
    FT_Error         error;
    FT_UInt          i;
    FT_Fixed         axiscoords[T1_MAX_MM_AXIS];
    PS_Blend         blend = face->blend;
    FT_UShort*       axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;


    error = T1_Get_Multi_Master( face, &mmaster );
    if ( error )
      goto Exit;

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmvar' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size      = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size = ALIGN_SIZE( mmaster.num_axis *
                                  sizeof ( FT_UShort ) );
    axis_size       = mmaster.num_axis * sizeof ( FT_Var_Axis );

    if ( FT_ALLOC( mmvar, mmvar_size +
                          axis_flags_size +
                          axis_size ) )
      goto Exit;

    mmvar->num_axis        = mmaster.num_axis;
    mmvar->num_designs     = mmaster.num_designs;
    mmvar->num_namedstyles = 0;                           /* Not supported */

    /* while axis flags are meaningless here, we have to provide the array */
    /* to make `FT_Get_Var_Axis_Flags' work: the function expects that the */
    /* values directly follow the data of `FT_MM_Var'                      */
    axis_flags = (FT_UShort*)( (char*)mmvar + mmvar_size );
    for ( i = 0; i < mmaster.num_axis; i++ )
      axis_flags[i] = 0;

    mmvar->axis       = (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
    mmvar->namedstyle = NULL;

    for ( i = 0; i < mmaster.num_axis; i++ )
    {
      mmvar->axis[i].name    = mmaster.axis[i].name;
      mmvar->axis[i].minimum = INT_TO_FIXED( mmaster.axis[i].minimum );
      mmvar->axis[i].maximum = INT_TO_FIXED( mmaster.axis[i].maximum );
      mmvar->axis[i].strid   = ~0U;                      /* Does not apply */
      mmvar->axis[i].tag     = ~0U;                      /* Does not apply */

      if ( !mmvar->axis[i].name )
        continue;

      if ( ft_strcmp( mmvar->axis[i].name, "Weight" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'g', 'h', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Width" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'd', 't', 'h' );
      else if ( ft_strcmp( mmvar->axis[i].name, "OpticalSize" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'o', 'p', 's', 'z' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Slant" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 's', 'l', 'n', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Italic" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'i', 't', 'a', 'l' );
    }

    mm_weights_unmap( blend->default_weight_vector,
                      axiscoords,
                      blend->num_axis );

    for ( i = 0; i < mmaster.num_axis; i++ )
      mmvar->axis[i].def = mm_axis_unmap( &blend->design_map[i],
                                          axiscoords[i] );

    *master = mmvar;

  Exit:
    return error;
  }